

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O1

void __thiscall Seq::gen(Seq *this,int b,int a)

{
  element_type *peVar1;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  uint i;
  undefined4 in_register_00000034;
  ulong uVar2;
  element_type *peVar3;
  
  uVar2 = CONCAT44(in_register_00000034,b);
  peVar3 = (this->stmt1).super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1 = (this->stmt2).super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != Stmt::Null.super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    if (peVar1 == Stmt::Null.super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      UNRECOVERED_JUMPTABLE_00 = (peVar3->super_Node)._vptr_Node[2];
    }
    else {
      i = Node::labels + 1;
      Node::labels = i;
      (*(peVar3->super_Node)._vptr_Node[2])(peVar3,uVar2,(ulong)i);
      Node::emitlabel((Node *)this,i);
      peVar3 = (this->stmt2).super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = (peVar3->super_Node)._vptr_Node[2];
      uVar2 = (ulong)i;
    }
    (*UNRECOVERED_JUMPTABLE_00)(peVar3,uVar2,(ulong)(uint)a);
    return;
  }
  UNRECOVERED_JUMPTABLE_00 = (peVar1->super_Node)._vptr_Node[2];
  (*UNRECOVERED_JUMPTABLE_00)(peVar1,uVar2,(ulong)(uint)a,UNRECOVERED_JUMPTABLE_00);
  return;
}

Assistant:

void gen(int b, int a) override {
		if (stmt1 == Stmt::Null) stmt2->gen(b, a);
		else if (stmt2 == Stmt::Null) stmt1->gen(b, a);
		else {
			int label = newlabel();
			stmt1->gen(b, label);
			emitlabel(label);
			stmt2->gen(label, a);
		}
	}